

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsoncbor.cpp
# Opt level: O2

QCborMap __thiscall QCborMap::fromJsonObject(QCborMap *this,QJsonObject *obj)

{
  long in_FS_OFFSET;
  QExplicitlySharedDataPointer<QCborContainerPrivate> local_38;
  QExplicitlySharedDataPointer<QCborContainerPrivate> local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (this->d).d.ptr = (QCborContainerPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QCborMap(this);
  local_38.d.ptr = (totally_ordered_wrapper<QCborContainerPrivate_*>)(QCborContainerPrivate *)0x0;
  std::
  __exchange<QExplicitlySharedDataPointer<QCborContainerPrivate>,QExplicitlySharedDataPointer<QCborContainerPrivate>>
            (&local_30,&obj->o);
  QExplicitlySharedDataPointer<QCborContainerPrivate>::operator=(&this->d,&local_30);
  QExplicitlySharedDataPointer<QCborContainerPrivate>::~QExplicitlySharedDataPointer(&local_30);
  QExplicitlySharedDataPointer<QCborContainerPrivate>::~QExplicitlySharedDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (QExplicitlySharedDataPointer<QCborContainerPrivate>)
           (QExplicitlySharedDataPointer<QCborContainerPrivate>)this;
  }
  __stack_chk_fail();
}

Assistant:

QCborMap QCborMap::fromJsonObject(QJsonObject &&obj) noexcept
{
    QCborMap result;
    result.d = std::exchange(obj.o, {});
    return result;
}